

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::ImageButton(RenderTexture *texture,int framePadding,Color *bgColor,Color *tintColor)

{
  bool bVar1;
  uint uVar2;
  uint extraout_var;
  Vector2f local_28;
  
  uVar2 = (*(texture->super_RenderTarget)._vptr_RenderTarget[2])();
  local_28.y = (float)extraout_var;
  local_28.x = (float)uVar2;
  bVar1 = ImageButton(texture,&local_28,framePadding,bgColor,tintColor);
  return bVar1;
}

Assistant:

bool ImageButton(const sf::RenderTexture& texture, const int framePadding, const sf::Color& bgColor,
                 const sf::Color& tintColor) {
    return ImageButton(texture, static_cast<sf::Vector2f>(texture.getSize()), framePadding, bgColor,
                       tintColor);
}